

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

void pnga_msg_sync(void)

{
  Integer IVar1;
  int p_grp;
  
  IVar1 = pnga_pgroup_get_default();
  if ((int)IVar1 < 1) {
    armci_msg_barrier();
  }
  else {
    armci_msg_group_barrier((ARMCI_Group *)0x229012);
  }
  return;
}

Assistant:

void pnga_msg_sync()
{
#ifdef MSG_COMMS_MPI
    int p_grp = (int)pnga_pgroup_get_default(); 
    if(p_grp>0)
       armci_msg_group_barrier(&(PGRP_LIST[p_grp].group));
    else
       armci_msg_barrier();
#else
     tcg_synch(GA_TYPE_SYN);
#endif
}